

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void VerifyHash(void *key,int len,uint32_t seed,void *out)

{
  char *in_RCX;
  uint32_t in_EDX;
  int in_ESI;
  char *in_RDI;
  uint32_t local_10;
  int local_c;
  char *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  g_inputVCode = MurmurOAAT(in_RDI,in_ESI,g_inputVCode);
  g_inputVCode = MurmurOAAT((char *)&local_10,4,g_inputVCode);
  (*g_hashUnderTest->hash)(local_8,local_c,local_10,in_RCX);
  g_outputVCode = MurmurOAAT(in_RCX,g_hashUnderTest->hashbits / 8,g_outputVCode);
  return;
}

Assistant:

void VerifyHash ( const void * key, int len, uint32_t seed, void * out )
{
  g_inputVCode = MurmurOAAT((const char *)key, len, g_inputVCode);
  g_inputVCode = MurmurOAAT((const char *)&seed, sizeof(uint32_t), g_inputVCode);

  g_hashUnderTest->hash(key, len, seed, out);

  g_outputVCode = MurmurOAAT((const char *)out, g_hashUnderTest->hashbits/8, g_outputVCode);
}